

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

int64_t motion_mode_rd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,BLOCK_SIZE bsize,
                      RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,
                      HandleInterModeArgs *args,int64_t ref_best_rd,int64_t *ref_skip_rd,
                      int *rate_mv,BUFFER_SET *orig_dst,int64_t *best_est_rd,int do_tx_search,
                      InterModesInfo *inter_modes_info,int eval_motion_mode,int64_t *yrd)

{
  int (*paiVar1) [2];
  RD_STATS *pRVar2;
  int64_t *piVar3;
  uint8_t uVar4;
  char cVar5;
  char cVar6;
  BLOCK_SIZE BVar7;
  PREDICTION_MODE PVar8;
  uint32_t uVar9;
  SequenceHeader *pSVar10;
  AV1_COMP *mbmi;
  scale_factors *psVar11;
  MB_MODE_INFO *pMVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  int64_t iVar19;
  InterModeRdModel *pIVar20;
  macroblockd_plane *pmVar21;
  undefined7 uVar22;
  int_mv *piVar23;
  TileDataEnc *pTVar24;
  WarpedMotionParams *pWVar25;
  byte bVar26;
  byte bVar27;
  MOTION_MODE MVar28;
  uint32_t uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  int_mv iVar33;
  int_mv iVar34;
  int64_t iVar35;
  ulong uVar36;
  InterpFilter interp_filter;
  uint uVar37;
  int (*paiVar38) [3];
  ulong uVar39;
  buf_2d *pbVar40;
  uint uVar41;
  long lVar42;
  AV1_COMP *pAVar43;
  byte bVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  size_t sVar49;
  int iVar50;
  bool bVar51;
  double dVar52;
  long local_ce0;
  long local_cd0;
  int tmp_rate_mv;
  ulong local_cc0;
  int tmp_rate2;
  MACROBLOCKD *local_cb0;
  int local_ca8;
  int local_ca4;
  long local_ca0;
  double local_c98;
  AV1_COMP *local_c90;
  int local_c88;
  int local_c84;
  int local_c80;
  int_interpfilters local_c7c;
  int local_c78;
  int local_c74;
  int_mv *local_c70;
  long local_c68;
  undefined4 local_c60;
  undefined3 uStack_c5c;
  double local_c58;
  int (*local_c50) [2];
  ulong local_c48;
  ulong local_c40;
  ulong local_c38;
  int *local_c30;
  int *local_c28;
  TileDataEnc *local_c20;
  ulong local_c18;
  int local_c10;
  int_mv ref_mv;
  ulong local_c08;
  undefined8 local_c00;
  uint8_t *local_bf8;
  AV1_COMP *local_bf0;
  WarpedMotionParams *local_be8;
  ulong local_be0;
  int64_t local_bd8;
  ulong local_bd0;
  WarpedMotionParams wm_params0;
  int64_t local_b38;
  int64_t iStack_b30;
  RD_STATS best_rd_stats_uv;
  RD_STATS best_rd_stats_y;
  int pts_inref [16];
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int pts [16];
  MB_MODE_INFO best_mbmi;
  MB_MODE_INFO base_mbmi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  pSVar10 = (cpi->common).seq_params;
  uVar4 = pSVar10->monochrome;
  mbmi = (AV1_COMP *)*(x->e_mbd).mi;
  cVar5 = *(MV_REFERENCE_FRAME *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1);
  bVar26 = *(PREDICTION_MODE *)((long)&((macroblock_plane *)&mbmi->ppi)->src_diff + 2);
  local_cc0 = (ulong)bVar26;
  if (pSVar10->enable_interintra_compound == '\0') {
LAB_00222de5:
    uVar39 = 0;
  }
  else {
    uVar39 = 0;
    if ((0xf8 < (byte)(*(BLOCK_SIZE *)&((macroblock_plane *)&mbmi->ppi)->src_diff - BLOCK_32X64)) &&
       (0xfb < (byte)(bVar26 - 0x11))) {
      if ('\0' < cVar5 || *(char *)(mbmi->enc_quant_dequant_params).quants.y_quant[0] < '\x01')
      goto LAB_00222de5;
      uVar39 = ((ulong)(byte)(mbmi->enc_quant_dequant_params).quants.y_quant[9][4] &
               0xffffffffffffff02) >> 1;
    }
  }
  local_c90 = (AV1_COMP *)&cpi->common;
  local_cb0 = &x->e_mbd;
  local_c74 = rd_stats->rate;
  local_ca4 = *rate_mv;
  cVar6 = *(char *)(mbmi->enc_quant_dequant_params).quants.y_quant[0];
  local_c28 = x->warp_sample_info[cVar6].pts;
  local_c30 = x->warp_sample_info[cVar6].pts_inref;
  *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) = '\x01';
  local_bd8 = 0x7fffffffffffffff;
  *yrd = 0x7fffffffffffffff;
  local_c48 = 1;
  local_ca8 = 0;
  pAVar43 = mbmi;
  local_c20 = tile_data;
  if ((cpi->common).features.switchable_motion_mode == true) {
    if (*(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 10) == '\0') {
LAB_00223037:
      bVar27 = 0;
    }
    else {
      iVar50 = (x->e_mbd).cur_frame_force_integer_mv;
      BVar7 = *(BLOCK_SIZE *)&((macroblock_plane *)&mbmi->ppi)->src_diff;
      if (iVar50 == 0) {
        bVar44 = block_size_high[BVar7];
        if (block_size_wide[BVar7] < block_size_high[BVar7]) {
          bVar44 = block_size_wide[BVar7];
        }
        if (((bVar26 == 0xf || bVar26 == 0x17) &&
            (1 < (x->e_mbd).global_motion
                 [*(char *)(mbmi->enc_quant_dequant_params).quants.y_quant[0]].wmtype)) &&
           (7 < bVar44)) goto LAB_00223037;
      }
      else {
        bVar44 = block_size_high[BVar7];
        if (block_size_wide[BVar7] < block_size_high[BVar7]) {
          bVar44 = block_size_wide[BVar7];
        }
      }
      bVar27 = 0;
      if ((7 < bVar44) && (0xf3 < (byte)(bVar26 - 0x19))) {
        if (-1 < *(MV_REFERENCE_FRAME *)
                  ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1)) goto LAB_00223037;
        bVar27 = 1;
        if ((cpi->common).features.allow_warped_motion != false && iVar50 == 0) {
          psVar11 = (x->e_mbd).block_ref_scale_factors[0];
          iVar50 = psVar11->x_scale_fp;
          if (((iVar50 == -1) || (iVar30 = psVar11->y_scale_fp, iVar30 == -1)) ||
             (iVar30 == 0x4000 && iVar50 == 0x4000)) {
            uVar45 = x->warp_sample_info[cVar6].num;
            uVar36 = (ulong)uVar45;
            if ((int)uVar45 < 0) {
              bVar26 = av1_findSamples((AV1_COMMON *)local_c90,local_cb0,local_c28,local_c30);
              uVar36 = (ulong)bVar26;
              x->warp_sample_info[cVar6].num = (uint)bVar26;
              pAVar43 = (AV1_COMP *)*(x->e_mbd).mi;
            }
            *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) =
                 (uint8_t)uVar36;
            local_c48 = uVar36 & 0xff;
            bVar27 = 2 - ((uint8_t)uVar36 == '\0');
          }
        }
      }
    }
  }
  else {
    bVar27 = 0;
  }
  local_bd0 = uVar39;
  memcpy(&base_mbmi,mbmi,0xb0);
  interp_filter = (cpi->common).features.interp_filter;
  if (((*(byte *)((long)(pAVar43->enc_quant_dequant_params).quants.y_quant[9] + 7) & 0x40) == 0) &&
     (*(MOTION_MODE *)((long)(pAVar43->enc_quant_dequant_params).quants.y_quant[0] + 8) != '\x02'))
  {
    PVar8 = *(PREDICTION_MODE *)((long)&((macroblock_plane *)&pAVar43->ppi)->src_diff + 2);
    if ((PVar8 == '\x17') || (PVar8 == '\x0f')) {
      BVar7 = *(BLOCK_SIZE *)&((macroblock_plane *)&pAVar43->ppi)->src_diff;
      bVar26 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar7];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar7] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar7]) {
        bVar26 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar7]
        ;
      }
      if (1 < bVar26) {
        bVar26 = 1;
        lVar46 = 0;
        do {
          if ((x->e_mbd).global_motion
              [*(MV_REFERENCE_FRAME *)
                ((long)(pAVar43->enc_quant_dequant_params).quants.y_quant[0] + lVar46)].wmtype ==
              '\x01') goto LAB_002230bf;
          bVar44 = ~bVar26;
          local_ca8 = 0;
          lVar46 = 1;
          bVar26 = 0;
        } while (!(bool)(bVar44 & 1 |
                        *(MV_REFERENCE_FRAME *)
                         ((long)(pAVar43->enc_quant_dequant_params).quants.y_quant[0] + 1) < '\x01')
                );
        goto LAB_002230e7;
      }
    }
LAB_002230bf:
    local_ca8 = av1_get_switchable_rate
                          (x,local_cb0,interp_filter,
                           (uint)((cpi->common).seq_params)->enable_dual_filter);
  }
LAB_002230e7:
  pTVar24 = local_c20;
  local_c18 = (ulong)bVar27;
  uVar41 = (uint)bVar27 + (int)local_bd0;
  uVar45 = uVar41;
  uVar39 = 0;
  if (eval_motion_mode == 0) {
    uVar45 = 0;
    uVar39 = (ulong)((uint)(0xc3fe00L >> (bsize & 0x3f)) & 4);
  }
  bVar51 = (cpi->sf).winner_mode_sf.motion_mode_for_winner_cand != 0;
  if (!bVar51) {
    uVar45 = uVar41;
  }
  bVar51 = bVar51 && eval_motion_mode != 0;
  if (((cpi->sf).inter_sf.extra_prune_warped != 0) &&
     (BLOCK_16X16 < *(BLOCK_SIZE *)&((macroblock_plane *)&mbmi->ppi)->src_diff)) {
    uVar45 = 0;
  }
  local_c10 = (uint)(uVar4 == '\0') * 2;
  local_be0 = (ulong)(local_c10 + 1);
  if ((int)uVar45 < (int)(uint)bVar51) {
    *(char *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) = cVar5;
    *rate_mv = local_ca4;
  }
  else {
    local_c68 = ref_best_rd;
    local_c38 = (ulong)(uint)(x->e_mbd).mi_row;
    if (interp_filter == MULTITAP_SHARP2) {
      interp_filter = EIGHTTAP_REGULAR;
    }
    local_ca0 = (long)*(int *)((long)(cpi->sf).inter_sf.txfm_rd_gate_level + uVar39);
    local_c7c.as_int = (uint)interp_filter << 0x10 | (uint)interp_filter;
    local_c80 = local_c74 - local_ca4;
    pIVar20 = local_c20->inter_mode_rd_models;
    local_c20 = (TileDataEnc *)local_c20->inter_mode_rd_models;
    local_b38 = 0x7fffffffffffffff;
    iStack_b30 = 0x7fffffffffffffff;
    local_c40 = (ulong)(uint)(x->e_mbd).mi_col;
    local_be8 = (WarpedMotionParams *)
                ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 0xc);
    uVar39 = (ulong)(uint)((int)local_c48 * 8);
    local_c70 = (int_mv *)&mbmi->field_0x8;
    paiVar1 = (x->mode_costs).interintra_cost;
    local_c50 = (x->mode_costs).skip_txfm_cost;
    local_bf8 = (x->txfm_search_info).blk_skip;
    local_c88 = 0x7fffffff;
    local_c00 = 0;
    local_ce0 = 0x7fffffffffffffff;
    local_c78 = local_ca4;
    local_c84 = 0;
    local_cd0 = 0x7fffffffffffffff;
    local_c08 = 0;
    uVar41 = (uint)bVar51;
    local_bf0 = cpi;
    do {
      if ((uVar41 == 0) || (args->skip_motion_mode == 0)) {
        tmp_rate2 = local_c74;
        tmp_rate_mv = local_ca4;
        pAVar43 = mbmi;
        memcpy(mbmi,&base_mbmi,0xb0);
        piVar23 = local_c70;
        MVar28 = (MOTION_MODE)uVar41;
        if ((uint)local_c18 < uVar41) {
          MVar28 = '\0';
        }
        *(MOTION_MODE *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 8) = MVar28;
        if (((byte)((cpi->oxcf).motion_mode_cfg.enable_obmc ^ 1U |
                   (cpi->ppi->frame_probs).obmc_probs
                   [(cpi->ppi->gf_group).update_type[cpi->gf_frame_index]][bsize] <
                   (cpi->sf).inter_sf.prune_obmc_prob_thresh) != 1) || (MVar28 != '\x01')) {
          if (((uint)local_c18 < uVar41) || (MVar28 != '\0')) {
            if (MVar28 == '\x02') {
              *(MOTION_MODE *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 8) =
                   '\x02';
              *(TransformationType *)
               ((long)&((buf_2d *)((mbmi->enc_quant_dequant_params).quants.y_quant + 2))->buf0 + 4)
                   = '\x03';
              ((int_interpfilters *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 4))
              ->as_int = (uint32_t)local_c7c;
              memcpy(pts,local_c28,uVar39);
              memcpy(pts_inref,local_c30,uVar39);
              bVar26 = *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9);
              if (1 < bVar26) {
                bVar26 = av1_selectSamples(&local_c70->as_mv,pts,pts_inref,(uint)bVar26,bsize);
                *(byte *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) = bVar26;
              }
              pWVar25 = local_be8;
              iVar50 = av1_find_projection((uint)bVar26,pts,pts_inref,bsize,
                                           (int)(((int_mv *)&mbmi->field_0x8)->as_mv).row,
                                           (int)*(short *)&mbmi->field_0xa,local_be8,(int)local_c38,
                                           (int)local_c40);
              if (iVar50 != 0) goto LAB_0022435f;
              if (((byte)local_cc0 < 0x19) && ((0x1790000U >> ((uint)local_cc0 & 0x1f) & 1) != 0)) {
                local_c98 = (double)CONCAT44(local_c98._4_4_,((int_mv *)&mbmi->field_0x8)->as_int);
                wm_params0.wmtype = pWVar25->wmtype;
                wm_params0.invalid = pWVar25->invalid;
                wm_params0._34_2_ = *(undefined2 *)&pWVar25->field_0x22;
                wm_params0.wmmat._0_8_ = *(undefined8 *)pWVar25->wmmat;
                wm_params0.wmmat._8_8_ = *(undefined8 *)(pWVar25->wmmat + 2);
                wm_params0.wmmat._16_8_ = *(undefined8 *)(pWVar25->wmmat + 4);
                wm_params0.alpha = pWVar25->alpha;
                wm_params0.beta = pWVar25->beta;
                wm_params0.gamma = pWVar25->gamma;
                wm_params0.delta = pWVar25->delta;
                local_c58 = (double)CONCAT71(local_c58._1_7_,
                                             *(uint8_t *)
                                              ((long)(mbmi->enc_quant_dequant_params).quants.y_quant
                                                     [0] + 9));
                ref_mv = av1_get_ref_mv(x,0);
                av1_make_default_subpel_ms_params(&ms_params,cpi,x,bsize,&ref_mv.as_mv,(int *)0x0);
                av1_refine_warped_mv
                          (local_cb0,(AV1_COMMON *)local_c90,&ms_params,bsize,local_c28,local_c30,
                           (int)local_c48,(cpi->sf).mv_sf.warp_search_method,
                           (cpi->sf).mv_sf.warp_search_iters);
                if (local_c98._0_4_ == ((int_mv *)&mbmi->field_0x8)->as_int) {
                  local_be8->wmtype = wm_params0.wmtype;
                  local_be8->invalid = wm_params0.invalid;
                  *(undefined2 *)&local_be8->field_0x22 = wm_params0._34_2_;
                  *(undefined8 *)(local_be8->wmmat + 4) = wm_params0.wmmat._16_8_;
                  local_be8->alpha = wm_params0.alpha;
                  local_be8->beta = wm_params0.beta;
                  local_be8->gamma = wm_params0.gamma;
                  local_be8->delta = wm_params0.delta;
                  *(undefined8 *)local_be8->wmmat = wm_params0.wmmat._0_8_;
                  *(undefined8 *)(local_be8->wmmat + 2) = wm_params0.wmmat._8_8_;
                  *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) =
                       local_c58._0_1_;
                }
                else {
                  tmp_rate_mv = av1_mv_bit_cost((MV *)local_c70,&ref_mv.as_mv,
                                                x->mv_costs->nmv_joint_cost,
                                                x->mv_costs->mv_cost_stack,0x6c);
                  tmp_rate2 = tmp_rate_mv + local_c80;
                }
              }
              pAVar43 = local_c90;
              av1_enc_build_inter_predictor
                        ((AV1_COMMON *)local_c90,local_cb0,(int)local_c38,(int)local_c40,
                         (BUFFER_SET *)0x0,bsize,0,
                         (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
            }
            else if (MVar28 == '\x01') {
              uVar9 = local_c70->as_int;
              uVar29 = uVar9;
              if (((uint)local_cc0 < 0x19) && ((0x1790000U >> ((uint)local_cc0 & 0x1f) & 1) != 0)) {
                av1_single_motion_search
                          (cpi,x,bsize,0,&tmp_rate_mv,0x7fffffff,(inter_mode_info *)0x0,local_c70,
                           (HandleInterModeArgs *)0x0);
                tmp_rate2 = tmp_rate_mv + local_c80;
                uVar29 = piVar23->as_int;
              }
              if ((eval_motion_mode != 0) || (uVar29 != uVar9)) {
                av1_enc_build_inter_predictor
                          ((AV1_COMMON *)local_c90,local_cb0,(int)local_c38,(int)local_c40,orig_dst,
                           bsize,0,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
              }
              pAVar43 = local_c90;
              av1_build_obmc_inter_prediction
                        ((AV1_COMMON *)local_c90,local_cb0,args->above_pred_buf,
                         args->above_pred_stride,args->left_pred_buf,args->left_pred_stride);
            }
            else if (((uint)local_c18 < uVar41) &&
                    (pAVar43 = cpi,
                    iVar50 = av1_handle_inter_intra_mode
                                       (cpi,x,bsize,(MB_MODE_INFO *)mbmi,args,local_c68,&tmp_rate_mv
                                        ,&tmp_rate2,orig_dst), iVar50 < 0)) goto LAB_0022435f;
          }
          pMVar12 = *(x->e_mbd).mi;
          bVar26 = pMVar12->mode;
          if ((bVar26 == 0x13) || (bVar26 == 0x15)) {
            pAVar43 = (AV1_COMP *)x;
            iVar34 = av1_get_ref_mv(x,1);
            if (pMVar12->mv[1].as_int != iVar34.as_int) goto LAB_00223931;
          }
          else if (bVar26 == 0x18) {
            iVar34 = av1_get_ref_mv(x,0);
            pAVar43 = (AV1_COMP *)x;
            iVar33 = av1_get_ref_mv(x,1);
            if ((pMVar12->mv[0].as_int != iVar34.as_int) && (pMVar12->mv[1].as_int != iVar33.as_int)
               ) {
LAB_00223931:
              (x->txfm_search_info).skip_txfm = '\0';
              rd_stats->dist = 0;
              rd_stats->sse = 0;
              rd_stats->skip_txfm = '\x01';
              rd_stats->rate = tmp_rate2;
              uVar36 = (ulong)*(byte *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 8
                                       );
              iVar50 = tmp_rate2;
              if (uVar36 != 2) {
                iVar50 = tmp_rate2 + local_ca8;
                rd_stats->rate = iVar50;
              }
              if ((int)local_bd0 != 0) {
                iVar50 = iVar50 + paiVar1[""[bsize]]
                                  [*(MV_REFERENCE_FRAME *)
                                    ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1)
                                   == '\0'];
                rd_stats->rate = iVar50;
                pAVar43 = (AV1_COMP *)paiVar1;
              }
              if ((bVar27 != 0) &&
                 (*(MV_REFERENCE_FRAME *)
                   ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) != '\0')) {
                paiVar38 = (x->mode_costs).motion_mode_cost + bsize;
                if (bVar27 != 2) {
                  paiVar38 = (int (*) [3])((x->mode_costs).motion_mode_cost1 + bsize);
                }
                iVar50 = iVar50 + (*paiVar38)[uVar36];
                rd_stats->rate = iVar50;
              }
              if (do_tx_search == 0) {
                ms_params.allow_hp = -1;
                ms_params._4_4_ = 0xffffffff;
                pts[0] = -1;
                pts[1] = -1;
                wm_params0.wmmat._0_8_ = wm_params0.wmmat._0_8_ & 0xffffffff00000000;
                pts_inref[0] = 0;
                pts_inref[1] = 0;
                iVar50 = (cpi->sf).inter_sf.inter_mode_rd_model_estimation;
                if (iVar50 == 2) {
LAB_00223b72:
                  model_rd_for_sb_with_curvfit
                            (pAVar43,bsize,x,local_cb0,0,local_c10,wm_params0.wmmat,
                             (int64_t *)pts_inref,(uint8_t *)0x0,(int64_t *)&ms_params,(int *)0x0,
                             (int64_t *)0x0,(int64_t *)0x0);
                  pts[0] = (int)(ulong)x->pred_sse[(*(x->e_mbd).mi)->ref_frame[0]];
                  pts[1] = (int)((ulong)x->pred_sse[(*(x->e_mbd).mi)->ref_frame[0]] >> 0x20);
                  uVar36 = wm_params0.wmmat._0_8_ & 0xffffffff;
                  lVar46 = pts_inref._0_8_;
                }
                else if (iVar50 == 1) {
                  iVar35 = get_sse(cpi,x,(int64_t *)pts);
                  uVar36 = 0;
                  ms_params._0_8_ = iVar35;
                  if (pIVar20[bsize].ready == 0) {
                    lVar46 = 0;
                  }
                  else {
                    dVar13 = pTVar24->inter_mode_rd_models[bsize].dist_mean;
                    lVar46 = iVar35;
                    if (dVar13 <= (double)iVar35) {
                      local_c98 = (double)iVar35;
                      local_c58 = dVar13;
                      dVar13 = round(dVar13);
                      dVar52 = pTVar24->inter_mode_rd_models[bsize].a * local_c98 +
                               pTVar24->inter_mode_rd_models[bsize].b;
                      lVar46 = (long)dVar13;
                      if (0.01 <= ABS(dVar52)) {
                        dVar52 = (local_c98 - local_c58) / dVar52;
                        if (0.0 <= dVar52) {
                          dVar13 = round(dVar52);
                          uVar36 = (ulong)dVar13;
                          if (0x3ffffffe < (long)uVar36) goto LAB_00223ef5;
                          if (0 < (int)uVar36) goto LAB_00223f0a;
                        }
                        wm_params0.wmmat._0_8_ = wm_params0.wmmat._0_8_ & 0xffffffff00000000;
                        pts_inref._0_8_ = iVar35;
                        goto LAB_00223e9c;
                      }
LAB_00223ef5:
                      wm_params0.wmmat[0] = 0x3fffffff;
                      uVar36 = 0x3fffffff;
                    }
                  }
                }
                else {
                  if ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) goto LAB_00223b72;
LAB_00223e9c:
                  uVar36 = 0;
                  lVar46 = pts_inref._0_8_;
                }
LAB_00223f0a:
                iVar50 = rd_stats->rate;
                iVar32 = (int)uVar36 + iVar50;
                iVar30 = x->rdmult;
                lVar48 = lVar46 * 0x80 + ((long)iVar32 * (long)iVar30 + 0x100 >> 9);
                if ((double)lVar48 * 0.8 <= (double)*best_est_rd) {
                  rd_stats->rate = iVar32;
                  rd_stats->dist = lVar46;
                  rd_stats->rdcost = lVar48;
                  if (lVar48 < *best_est_rd) {
                    *best_est_rd = lVar48;
                    lVar46 = 0x7fffffffffffffff;
                    if ((int)local_ca0 != 0) {
                      lVar46 = pts._0_8_ * 0x800 + ((long)iVar30 * (long)iVar50 + 0x100 >> 9);
                    }
                    ref_skip_rd[1] = lVar46;
                  }
                  if (((cpi->common).current_frame.reference_mode != '\0') || (cVar5 < '\x01')) {
                    local_c98 = (double)ms_params._0_8_;
                    iVar35 = rd_stats->rdcost;
                    iVar30 = inter_modes_info->num;
                    memcpy(inter_modes_info->mbmi_arr + iVar30,mbmi,0xb0);
                    inter_modes_info->mode_rate_arr[iVar30] = iVar50;
                    inter_modes_info->sse_arr[iVar30] = (int64_t)local_c98;
                    inter_modes_info->est_rd_arr[iVar30] = iVar35;
                    iVar50 = rd_stats->rate;
                    iVar32 = rd_stats->zero_rate;
                    iVar35 = rd_stats->dist;
                    iVar19 = rd_stats->sse;
                    piVar3 = &inter_modes_info->rd_cost_arr[iVar30].rdcost;
                    *piVar3 = rd_stats->rdcost;
                    piVar3[1] = iVar19;
                    pRVar2 = inter_modes_info->rd_cost_arr + iVar30;
                    pRVar2->rate = iVar50;
                    pRVar2->zero_rate = iVar32;
                    pRVar2->dist = iVar35;
                    uVar22 = *(undefined7 *)&rd_stats->field_0x21;
                    inter_modes_info->rd_cost_arr[iVar30].skip_txfm = rd_stats->skip_txfm;
                    *(undefined7 *)&inter_modes_info->rd_cost_arr[iVar30].field_0x21 = uVar22;
                    uVar22 = *(undefined7 *)&rd_stats_y->field_0x21;
                    inter_modes_info->rd_cost_y_arr[iVar30].skip_txfm = rd_stats_y->skip_txfm;
                    *(undefined7 *)&inter_modes_info->rd_cost_y_arr[iVar30].field_0x21 = uVar22;
                    iVar50 = rd_stats_y->rate;
                    iVar32 = rd_stats_y->zero_rate;
                    iVar35 = rd_stats_y->dist;
                    iVar19 = rd_stats_y->sse;
                    piVar3 = &inter_modes_info->rd_cost_y_arr[iVar30].rdcost;
                    *piVar3 = rd_stats_y->rdcost;
                    piVar3[1] = iVar19;
                    pRVar2 = inter_modes_info->rd_cost_y_arr + iVar30;
                    pRVar2->rate = iVar50;
                    pRVar2->zero_rate = iVar32;
                    pRVar2->dist = iVar35;
                    iVar50 = rd_stats_uv->rate;
                    iVar32 = rd_stats_uv->zero_rate;
                    iVar35 = rd_stats_uv->dist;
                    iVar19 = rd_stats_uv->sse;
                    piVar3 = &inter_modes_info->rd_cost_uv_arr[iVar30].rdcost;
                    *piVar3 = rd_stats_uv->rdcost;
                    piVar3[1] = iVar19;
                    uVar22 = *(undefined7 *)&rd_stats_uv->field_0x21;
                    inter_modes_info->rd_cost_uv_arr[iVar30].skip_txfm = rd_stats_uv->skip_txfm;
                    *(undefined7 *)&inter_modes_info->rd_cost_uv_arr[iVar30].field_0x21 = uVar22;
                    pRVar2 = inter_modes_info->rd_cost_uv_arr + iVar30;
                    pRVar2->rate = iVar50;
                    pRVar2->zero_rate = iVar32;
                    pRVar2->dist = iVar35;
                    inter_modes_info->num = inter_modes_info->num + 1;
                  }
                  *(uint8_t *)(mbmi->enc_quant_dequant_params).quants.y_quant[8] = '\0';
                  lVar46 = 0x7fffffffffffffff;
                  goto LAB_002240d7;
                }
                *(char *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) = cVar5;
              }
              else {
                lVar46 = 0x7fffffffffffffff;
                lVar48 = 0x7fffffffffffffff;
                if ((int)local_ca0 != 0) {
                  ms_params.allow_hp = -1;
                  ms_params._4_4_ = 0x7fffffff;
                  iVar35 = get_sse(cpi,x,(int64_t *)&ms_params);
                  uVar31 = 4;
                  if (((int)local_ca0 < 3) &&
                     (iVar50 = x->qindex * -2 + 0x27e >> 8, uVar31 = iVar50 * 4, iVar50 < 1)) {
                    uVar31 = 4;
                  }
                  iVar50 = rd_stats->rate;
                  lVar47 = *ref_skip_rd;
                  if (((long)(ulong)(x->source_variance <<
                                    ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                     [bsize] + 7 & 0x1f)) < lVar47) &&
                     (*(int *)(&DAT_0050c970 + local_ca0 * 4) <= x->qindex)) {
                    uVar31 = uVar31 * *(int *)(&DAT_0050c950 + local_ca0 * 4);
                  }
                  else if ((int)local_ca0 < 2) {
                    uVar31 = (uVar31 >> 1) * 3;
                  }
                  lVar46 = (long)x->rdmult * (long)iVar50 + 0x100 >> 9;
                  lVar48 = iVar35 * 0x80 + lVar46;
                  lVar46 = ms_params._0_8_ * 0x800 + lVar46;
                  if ((lVar47 != 0x7fffffffffffffff) && (lVar47 * (int)uVar31 >> 2 < lVar48))
                  goto LAB_0022435f;
                }
                iVar30 = av1_txfm_search(cpi,x,bsize,rd_stats,rd_stats_y,rd_stats_uv,iVar50,
                                         local_c68);
                if (iVar30 == 0) {
                  if ((uVar41 == 0) && (rd_stats_y->rate == 0x7fffffff)) {
                    return local_bd8;
                  }
                }
                else {
                  pMVar12 = (x->e_mbd).above_mbmi;
                  uVar31 = 0;
                  uVar37 = 0;
                  if (pMVar12 != (MB_MODE_INFO *)0x0) {
                    uVar37 = (uint)pMVar12->skip_txfm;
                  }
                  pMVar12 = (x->e_mbd).left_mbmi;
                  if (pMVar12 != (MB_MODE_INFO *)0x0) {
                    uVar31 = (uint)pMVar12->skip_txfm;
                  }
                  uVar31 = uVar31 + uVar37;
                  if (rd_stats->skip_txfm == '\0') {
                    iVar30 = local_c50[uVar31][0] + rd_stats_y->rate;
                  }
                  else {
                    iVar30 = local_c50[uVar31][1];
                  }
                  iVar32 = x->rdmult;
                  lVar47 = rd_stats_y->dist;
                  lVar42 = rd_stats->dist * 0x80 +
                           ((long)rd_stats->rate * (long)iVar32 + 0x100 >> 9);
                  if (lVar42 < local_c68) {
                    *ref_skip_rd = lVar48;
                    ref_skip_rd[1] = lVar46;
                    local_c68 = lVar42;
                  }
                  lVar46 = lVar47 * 0x80 + ((long)(iVar30 + iVar50) * (long)iVar32 + 0x100 >> 9);
                  if ((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
                    lVar48 = rd_stats->dist;
                    lVar47 = rd_stats->sse;
                    lVar42 = lVar47 - lVar48;
                    if ((lVar42 != 0) &&
                       (iVar50 = rd_stats_uv->rate + rd_stats_y->rate +
                                 local_c50[uVar31]
                                 [(byte)(mbmi->enc_quant_dequant_params).quants.y_quant[8][0]],
                       iVar50 != 0)) {
                      BVar7 = *(BLOCK_SIZE *)&((macroblock_plane *)&mbmi->ppi)->src_diff;
                      if (((BLOCK_16X4 < BVar7) || ((0x30007U >> (BVar7 & 0x1f) & 1) == 0)) &&
                         (((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->num <
                          0x1900)) {
                        dVar13 = (double)lVar42 / (double)iVar50;
                        ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->num =
                             ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->num + 1;
                        dVar52 = ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->
                                 dist_sum + (double)lVar48;
                        dVar17 = ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->
                                 ld_sum + dVar13;
                        dVar16 = ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->
                                 sse_sse_sum;
                        dVar18 = ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->
                                 sse_ld_sum;
                        auVar14._8_4_ = SUB84(dVar17,0);
                        auVar14._0_8_ = dVar52;
                        auVar14._12_4_ = (int)((ulong)dVar17 >> 0x20);
                        ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->dist_sum =
                             dVar52;
                        ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->ld_sum =
                             (double)auVar14._8_8_;
                        dVar52 = (double)lVar47;
                        ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->sse_sum =
                             ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->sse_sum
                             + dVar52;
                        dVar16 = dVar52 * dVar52 + dVar16;
                        dVar18 = dVar13 * dVar52 + dVar18;
                        auVar15._8_4_ = SUB84(dVar18,0);
                        auVar15._0_8_ = dVar16;
                        auVar15._12_4_ = (int)((ulong)dVar18 >> 0x20);
                        ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->sse_sse_sum =
                             dVar16;
                        ((InterModeRdModel *)((long)local_c20 + (ulong)BVar7 * 0x70))->sse_ld_sum =
                             (double)auVar15._8_8_;
                      }
                    }
                  }
LAB_002240d7:
                  if ((local_cc0 == 0x17) || ((uint)local_cc0 == 0xf)) {
                    pMVar12 = *(x->e_mbd).mi;
                    if ((pMVar12->mode == '\x17') || (pMVar12->mode == '\x0f')) {
                      bVar26 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [pMVar12->bsize];
                      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [pMVar12->bsize] <
                          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [pMVar12->bsize]) {
                        bVar26 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [pMVar12->bsize];
                      }
                      if (1 < bVar26) {
                        bVar26 = 1;
                        lVar48 = 0;
                        do {
                          if ((x->e_mbd).global_motion[pMVar12->ref_frame[lVar48]].wmtype == '\x01')
                          goto LAB_0022416c;
                          bVar44 = ~bVar26;
                          lVar48 = 1;
                          bVar26 = 0;
                        } while (!(bool)(bVar44 & 1) && '\0' < pMVar12->ref_frame[1]);
                        *(int_interpfilters *)
                         ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 4) = local_c7c;
                      }
                    }
                  }
LAB_0022416c:
                  iVar50 = rd_stats->rate;
                  lVar48 = rd_stats->dist;
                  lVar47 = lVar48 * 0x80 + ((long)x->rdmult * (long)iVar50 + 0x100 >> 9);
                  if (uVar41 == 0) {
                    *(long *)((long)(*args->simple_rd)[0] +
                             (long)*(char *)(mbmi->enc_quant_dequant_params).quants.y_quant[0] * 8 +
                             (ulong)(*(ushort *)
                                      ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[9] + 7)
                                    & 0x30) * 4 + (ulong)((uint)local_cc0 * 0xc0)) = lVar47;
                    lVar48 = rd_stats->dist;
                  }
                  else {
                    cpi = local_bf0;
                    if (local_ce0 <= lVar47) goto LAB_0022435f;
                  }
                  memcpy(&best_mbmi,mbmi,0xb0);
                  local_c84 = rd_stats->zero_rate;
                  local_b38 = rd_stats->rdcost;
                  iStack_b30 = rd_stats->sse;
                  local_c08 = (ulong)CONCAT31((int3)((uint)local_c84 >> 8),rd_stats->skip_txfm);
                  local_c60._0_3_ = (undefined3)*(undefined4 *)&rd_stats->field_0x21;
                  local_c60._3_1_ = (undefined1)*(undefined4 *)&rd_stats->field_0x24;
                  uStack_c5c = (undefined3)((uint)*(undefined4 *)&rd_stats->field_0x24 >> 8);
                  best_rd_stats_y.skip_txfm = rd_stats_y->skip_txfm;
                  best_rd_stats_y._33_7_ = *(undefined7 *)&rd_stats_y->field_0x21;
                  best_rd_stats_y.rate = rd_stats_y->rate;
                  best_rd_stats_y.zero_rate = rd_stats_y->zero_rate;
                  best_rd_stats_y.dist = rd_stats_y->dist;
                  best_rd_stats_y.rdcost = rd_stats_y->rdcost;
                  best_rd_stats_y.sse = rd_stats_y->sse;
                  local_c78 = tmp_rate_mv;
                  *yrd = lVar46;
                  if (uVar4 == '\0') {
                    best_rd_stats_uv.skip_txfm = rd_stats_uv->skip_txfm;
                    best_rd_stats_uv._33_7_ = *(undefined7 *)&rd_stats_uv->field_0x21;
                    best_rd_stats_uv.rate = rd_stats_uv->rate;
                    best_rd_stats_uv.zero_rate = rd_stats_uv->zero_rate;
                    best_rd_stats_uv.dist = rd_stats_uv->dist;
                    best_rd_stats_uv.rdcost = rd_stats_uv->rdcost;
                    best_rd_stats_uv.sse = rd_stats_uv->sse;
                  }
                  sVar49 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
                  memcpy(best_blk_skip,local_bf8,sVar49);
                  memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,sVar49);
                  local_c00 = CONCAT71((int7)((ulong)mbmi >> 8),
                                       (uint8_t)(mbmi->enc_quant_dequant_params).quants.y_quant[8]
                                                [0]);
                  cpi = local_bf0;
                  local_ce0 = lVar47;
                  local_cd0 = lVar48;
                  local_c88 = iVar50;
                }
              }
            }
          }
          else if ((((bVar26 & 0xfd) != 0x14) && (bVar26 != 0x10)) ||
                  (pAVar43 = (AV1_COMP *)x, iVar34 = av1_get_ref_mv(x,0),
                  pMVar12->mv[0].as_int != iVar34.as_int)) goto LAB_00223931;
        }
      }
LAB_0022435f:
      bVar51 = uVar41 != uVar45;
      uVar41 = uVar41 + 1;
    } while (bVar51);
    *(char *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) = cVar5;
    *rate_mv = local_c78;
    if (local_ce0 == 0x7fffffffffffffff) goto LAB_002244cf;
    pMVar12 = *(x->e_mbd).mi;
    bVar26 = pMVar12->mode;
    if ((bVar26 == 0x13) || (bVar26 == 0x15)) {
      iVar34 = av1_get_ref_mv(x,1);
    }
    else {
      if (bVar26 != 0x18) {
        if ((((bVar26 & 0xfd) == 0x14) || (bVar26 == 0x10)) &&
           (iVar34 = av1_get_ref_mv(x,0), pMVar12->mv[0].as_int == iVar34.as_int))
        goto LAB_002244cf;
        goto LAB_0022456f;
      }
      iVar33 = av1_get_ref_mv(x,0);
      iVar34 = av1_get_ref_mv(x,1);
      if (pMVar12->mv[0].as_int == iVar33.as_int) goto LAB_002244cf;
    }
    if (pMVar12->mv[1].as_int != iVar34.as_int) {
LAB_0022456f:
      memcpy(mbmi,&best_mbmi,0xb0);
      rd_stats->rate = local_c88;
      rd_stats->zero_rate = local_c84;
      rd_stats->dist = local_cd0;
      rd_stats->rdcost = local_b38;
      rd_stats->sse = iStack_b30;
      rd_stats->skip_txfm = (uint8_t)local_c08;
      *(uint *)&rd_stats->field_0x24 = CONCAT31(uStack_c5c,local_c60._3_1_);
      *(undefined4 *)&rd_stats->field_0x21 = local_c60;
      rd_stats_y->rate = best_rd_stats_y.rate;
      rd_stats_y->zero_rate = best_rd_stats_y.zero_rate;
      rd_stats_y->dist = best_rd_stats_y.dist;
      rd_stats_y->rdcost = best_rd_stats_y.rdcost;
      rd_stats_y->sse = best_rd_stats_y.sse;
      rd_stats_y->skip_txfm = best_rd_stats_y.skip_txfm;
      *(undefined7 *)&rd_stats_y->field_0x21 = best_rd_stats_y._33_7_;
      if (uVar4 == '\0') {
        rd_stats_uv->skip_txfm = best_rd_stats_uv.skip_txfm;
        *(undefined7 *)&rd_stats_uv->field_0x21 = best_rd_stats_uv._33_7_;
        rd_stats_uv->rdcost = best_rd_stats_uv.rdcost;
        rd_stats_uv->sse = best_rd_stats_uv.sse;
        rd_stats_uv->rate = best_rd_stats_uv.rate;
        rd_stats_uv->zero_rate = best_rd_stats_uv.zero_rate;
        rd_stats_uv->dist = best_rd_stats_uv.dist;
      }
      sVar49 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
      memcpy(local_bf8,best_blk_skip,sVar49);
      memcpy((x->e_mbd).tx_type_map,best_tx_type_map,sVar49);
      (x->txfm_search_info).skip_txfm = (uint8_t)local_c00;
      ms_params.mv_limits._8_8_ = *(undefined8 *)(orig_dst->stride + 2);
      ms_params._16_8_ = orig_dst->plane[2];
      ms_params.mv_limits.col_min = orig_dst->stride[0];
      ms_params.mv_limits.col_max = orig_dst->stride[1];
      ms_params._0_8_ = orig_dst->plane[0];
      ms_params.cost_list = (int *)orig_dst->plane[1];
      pmVar21 = (x->e_mbd).plane;
      uVar39 = 0;
      do {
        pbVar40 = &pmVar21->dst;
        pbVar40->buf = (uint8_t *)ms_params.mv_cost_params.mvcost[uVar39 - 8];
        pbVar40->stride = *(int *)((long)ms_params.mv_cost_params.mvcost + uVar39 * 4 + -0x28);
        uVar39 = uVar39 + 1;
        pmVar21 = (macroblockd_plane *)(pbVar40 + 0x51);
      } while ((local_be0 & 0xffffffff) != uVar39);
      return 0;
    }
  }
LAB_002244cf:
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  ms_params.mv_limits._8_8_ = *(undefined8 *)(orig_dst->stride + 2);
  ms_params._16_8_ = orig_dst->plane[2];
  ms_params.mv_limits.col_min = orig_dst->stride[0];
  ms_params.mv_limits.col_max = orig_dst->stride[1];
  ms_params._0_8_ = orig_dst->plane[0];
  ms_params.cost_list = (int *)orig_dst->plane[1];
  pmVar21 = (x->e_mbd).plane;
  uVar39 = 0;
  do {
    pbVar40 = &pmVar21->dst;
    pbVar40->buf = (uint8_t *)ms_params.mv_cost_params.mvcost[uVar39 - 8];
    pbVar40->stride = *(int *)((long)ms_params.mv_cost_params.mvcost + uVar39 * 4 + -0x28);
    uVar39 = uVar39 + 1;
    pmVar21 = (macroblockd_plane *)(pbVar40 + 0x51);
  } while ((local_be0 & 0xffffffff) != uVar39);
  return local_bd8;
}

Assistant:

static int64_t motion_mode_rd(
    const AV1_COMP *const cpi, TileDataEnc *tile_data, MACROBLOCK *const x,
    BLOCK_SIZE bsize, RD_STATS *rd_stats, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats_uv, HandleInterModeArgs *const args, int64_t ref_best_rd,
    int64_t *ref_skip_rd, int *rate_mv, const BUFFER_SET *orig_dst,
    int64_t *best_est_rd, int do_tx_search, InterModesInfo *inter_modes_info,
    int eval_motion_mode, int64_t *yrd) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);
  const PREDICTION_MODE this_mode = mbmi->mode;
  const int rate2_nocoeff = rd_stats->rate;
  int best_xskip_txfm = 0;
  RD_STATS best_rd_stats, best_rd_stats_y, best_rd_stats_uv;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const int rate_mv0 = *rate_mv;
  const int interintra_allowed = cm->seq_params->enable_interintra_compound &&
                                 is_interintra_allowed(mbmi) &&
                                 mbmi->compound_idx;
  WARP_SAMPLE_INFO *const warp_sample_info =
      &x->warp_sample_info[mbmi->ref_frame[0]];
  int *pts0 = warp_sample_info->pts;
  int *pts_inref0 = warp_sample_info->pts_inref;

  assert(mbmi->ref_frame[1] != INTRA_FRAME);
  const MV_REFERENCE_FRAME ref_frame_1 = mbmi->ref_frame[1];
  av1_invalid_rd_stats(&best_rd_stats);
  mbmi->num_proj_ref = 1;  // assume num_proj_ref >=1
  MOTION_MODE last_motion_mode_allowed = SIMPLE_TRANSLATION;
  *yrd = INT64_MAX;
  if (features->switchable_motion_mode) {
    // Determine which motion modes to search if more than SIMPLE_TRANSLATION
    // is allowed.
    last_motion_mode_allowed = motion_mode_allowed(
        xd->global_motion, xd, mbmi, features->allow_warped_motion);
  }

  if (last_motion_mode_allowed == WARPED_CAUSAL) {
    // Collect projection samples used in least squares approximation of
    // the warped motion parameters if WARPED_CAUSAL is going to be searched.
    if (warp_sample_info->num < 0) {
      warp_sample_info->num = av1_findSamples(cm, xd, pts0, pts_inref0);
    }
    mbmi->num_proj_ref = warp_sample_info->num;
  }
  const int total_samples = mbmi->num_proj_ref;
  if (total_samples == 0) {
    // Do not search WARPED_CAUSAL if there are no samples to use to determine
    // warped parameters.
    last_motion_mode_allowed = OBMC_CAUSAL;
  }

  const MB_MODE_INFO base_mbmi = *mbmi;
  MB_MODE_INFO best_mbmi;
  const int interp_filter = features->interp_filter;
  const int switchable_rate =
      av1_is_interp_needed(xd)
          ? av1_get_switchable_rate(x, xd, interp_filter,
                                    cm->seq_params->enable_dual_filter)
          : 0;
  int64_t best_rd = INT64_MAX;
  int best_rate_mv = rate_mv0;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int mode_index_start, mode_index_end;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cm->seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_MOTION_MODE, eval_motion_mode);

  // Modify the start and end index according to speed features. For example,
  // if SIMPLE_TRANSLATION has already been searched according to
  // the motion_mode_for_winner_cand speed feature, update the mode_index_start
  // to avoid searching it again.
  update_mode_start_end_index(cpi, mbmi, &mode_index_start, &mode_index_end,
                              last_motion_mode_allowed, interintra_allowed,
                              eval_motion_mode);
  // Main function loop. This loops over all of the possible motion modes and
  // computes RD to determine the best one. This process includes computing
  // any necessary side information for the motion mode and performing the
  // transform search.
  for (int mode_index = mode_index_start; mode_index <= mode_index_end;
       mode_index++) {
    if (args->skip_motion_mode && mode_index) continue;
    int tmp_rate2 = rate2_nocoeff;
    const int is_interintra_mode = mode_index > (int)last_motion_mode_allowed;
    int tmp_rate_mv = rate_mv0;

    *mbmi = base_mbmi;
    if (is_interintra_mode) {
      // Only use SIMPLE_TRANSLATION for interintra
      mbmi->motion_mode = SIMPLE_TRANSLATION;
    } else {
      mbmi->motion_mode = (MOTION_MODE)mode_index;
      assert(mbmi->ref_frame[1] != INTRA_FRAME);
    }

    // Do not search OBMC if the probability of selecting it is below a
    // predetermined threshold for this update_type and block size.
    const FRAME_UPDATE_TYPE update_type =
        get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
    int use_actual_frame_probs = 1;
    int prune_obmc;
#if CONFIG_FPMT_TEST
    use_actual_frame_probs =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
    if (!use_actual_frame_probs) {
      prune_obmc = cpi->ppi->temp_frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
#endif
    if (use_actual_frame_probs) {
      prune_obmc = cpi->ppi->frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
    if ((!cpi->oxcf.motion_mode_cfg.enable_obmc || prune_obmc) &&
        mbmi->motion_mode == OBMC_CAUSAL)
      continue;

    if (mbmi->motion_mode == SIMPLE_TRANSLATION && !is_interintra_mode) {
      // SIMPLE_TRANSLATION mode: no need to recalculate.
      // The prediction is calculated before motion_mode_rd() is called in
      // handle_inter_mode()
    } else if (mbmi->motion_mode == OBMC_CAUSAL) {
      const uint32_t cur_mv = mbmi->mv[0].as_int;
      // OBMC_CAUSAL not allowed for compound prediction
      assert(!is_comp_pred);
      if (have_newmv_in_inter_mode(this_mode)) {
        av1_single_motion_search(cpi, x, bsize, 0, &tmp_rate_mv, INT_MAX, NULL,
                                 &mbmi->mv[0], NULL);
        tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
      }
      if ((mbmi->mv[0].as_int != cur_mv) || eval_motion_mode) {
        // Build the predictor according to the current motion vector if it has
        // not already been built
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                      0, av1_num_planes(cm) - 1);
      }
      // Build the inter predictor by blending the predictor corresponding to
      // this MV, and the neighboring blocks using the OBMC model
      av1_build_obmc_inter_prediction(
          cm, xd, args->above_pred_buf, args->above_pred_stride,
          args->left_pred_buf, args->left_pred_stride);
#if !CONFIG_REALTIME_ONLY
    } else if (mbmi->motion_mode == WARPED_CAUSAL) {
      int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
      mbmi->motion_mode = WARPED_CAUSAL;
      mbmi->wm_params.wmtype = DEFAULT_WMTYPE;
      mbmi->interp_filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));

      memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
      memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
      // Select the samples according to motion vector difference
      if (mbmi->num_proj_ref > 1) {
        mbmi->num_proj_ref = av1_selectSamples(
            &mbmi->mv[0].as_mv, pts, pts_inref, mbmi->num_proj_ref, bsize);
      }

      // Compute the warped motion parameters with a least squares fit
      //  using the collected samples
      if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                               mbmi->mv[0].as_mv.row, mbmi->mv[0].as_mv.col,
                               &mbmi->wm_params, mi_row, mi_col)) {
        assert(!is_comp_pred);
        if (have_newmv_in_inter_mode(this_mode)) {
          // Refine MV for NEWMV mode
          const int_mv mv0 = mbmi->mv[0];
          const WarpedMotionParams wm_params0 = mbmi->wm_params;
          const int num_proj_ref0 = mbmi->num_proj_ref;

          const int_mv ref_mv = av1_get_ref_mv(x, 0);
          SUBPEL_MOTION_SEARCH_PARAMS ms_params;
          av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                            &ref_mv.as_mv, NULL);

          // Refine MV in a small range.
          av1_refine_warped_mv(xd, cm, &ms_params, bsize, pts0, pts_inref0,
                               total_samples, cpi->sf.mv_sf.warp_search_method,
                               cpi->sf.mv_sf.warp_search_iters);

          if (mv0.as_int != mbmi->mv[0].as_int) {
            // Keep the refined MV and WM parameters.
            tmp_rate_mv = av1_mv_bit_cost(
                &mbmi->mv[0].as_mv, &ref_mv.as_mv, x->mv_costs->nmv_joint_cost,
                x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
            tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
          } else {
            // Restore the old MV and WM parameters.
            mbmi->mv[0] = mv0;
            mbmi->wm_params = wm_params0;
            mbmi->num_proj_ref = num_proj_ref0;
          }
        }

        // Build the warped predictor
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      av1_num_planes(cm) - 1);
      } else {
        continue;
      }
#endif  // !CONFIG_REALTIME_ONLY
    } else if (is_interintra_mode) {
      const int ret =
          av1_handle_inter_intra_mode(cpi, x, bsize, mbmi, args, ref_best_rd,
                                      &tmp_rate_mv, &tmp_rate2, orig_dst);
      if (ret < 0) continue;
    }

    // If we are searching newmv and the mv is the same as refmv, skip the
    // current mode
    if (!av1_check_newmv_joint_nonzero(cm, x)) continue;

    // Update rd_stats for the current motion mode
    txfm_info->skip_txfm = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = 1;
    rd_stats->rate = tmp_rate2;
    const ModeCosts *mode_costs = &x->mode_costs;
    if (mbmi->motion_mode != WARPED_CAUSAL) rd_stats->rate += switchable_rate;
    if (interintra_allowed) {
      rd_stats->rate +=
          mode_costs->interintra_cost[size_group_lookup[bsize]]
                                     [mbmi->ref_frame[1] == INTRA_FRAME];
    }
    if ((last_motion_mode_allowed > SIMPLE_TRANSLATION) &&
        (mbmi->ref_frame[1] != INTRA_FRAME)) {
      if (last_motion_mode_allowed == WARPED_CAUSAL) {
        rd_stats->rate +=
            mode_costs->motion_mode_cost[bsize][mbmi->motion_mode];
      } else {
        rd_stats->rate +=
            mode_costs->motion_mode_cost1[bsize][mbmi->motion_mode];
      }
    }

    int64_t this_yrd = INT64_MAX;

    if (!do_tx_search) {
      // Avoid doing a transform search here to speed up the overall mode
      // search. It will be done later in the mode search if the current
      // motion mode seems promising.
      int64_t curr_sse = -1;
      int64_t sse_y = -1;
      int est_residue_cost = 0;
      int64_t est_dist = 0;
      int64_t est_rd = 0;
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        curr_sse = get_sse(cpi, x, &sse_y);
        const int has_est_rd = get_est_rate_dist(tile_data, bsize, curr_sse,
                                                 &est_residue_cost, &est_dist);
        (void)has_est_rd;
        assert(has_est_rd);
      } else if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 2 ||
                 cpi->sf.rt_sf.use_nonrd_pick_mode) {
        model_rd_sb_fn[MODELRD_TYPE_MOTION_MODE_RD](
            cpi, bsize, x, xd, 0, num_planes - 1, &est_residue_cost, &est_dist,
            NULL, &curr_sse, NULL, NULL, NULL);
        sse_y = x->pred_sse[xd->mi[0]->ref_frame[0]];
      }
      est_rd = RDCOST(x->rdmult, rd_stats->rate + est_residue_cost, est_dist);
      if (est_rd * 0.80 > *best_est_rd) {
        mbmi->ref_frame[1] = ref_frame_1;
        continue;
      }
      const int mode_rate = rd_stats->rate;
      rd_stats->rate += est_residue_cost;
      rd_stats->dist = est_dist;
      rd_stats->rdcost = est_rd;
      if (rd_stats->rdcost < *best_est_rd) {
        *best_est_rd = rd_stats->rdcost;
        assert(sse_y >= 0);
        ref_skip_rd[1] = txfm_rd_gate_level
                             ? RDCOST(x->rdmult, mode_rate, (sse_y << 4))
                             : INT64_MAX;
      }
      if (cm->current_frame.reference_mode == SINGLE_REFERENCE) {
        if (!is_comp_pred) {
          assert(curr_sse >= 0);
          inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                                rd_stats->rdcost, rd_stats, rd_stats_y,
                                rd_stats_uv, mbmi);
        }
      } else {
        assert(curr_sse >= 0);
        inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                              rd_stats->rdcost, rd_stats, rd_stats_y,
                              rd_stats_uv, mbmi);
      }
      mbmi->skip_txfm = 0;
    } else {
      // Perform full transform search
      int64_t skip_rd = INT64_MAX;
      int64_t skip_rdy = INT64_MAX;
      if (txfm_rd_gate_level) {
        // Check if the mode is good enough based on skip RD
        int64_t sse_y = INT64_MAX;
        int64_t curr_sse = get_sse(cpi, x, &sse_y);
        skip_rd = RDCOST(x->rdmult, rd_stats->rate, curr_sse);
        skip_rdy = RDCOST(x->rdmult, rd_stats->rate, (sse_y << 4));
        int eval_txfm = check_txfm_eval(x, bsize, ref_skip_rd[0], skip_rd,
                                        txfm_rd_gate_level, 0);
        if (!eval_txfm) continue;
      }

      // Do transform search
      const int mode_rate = rd_stats->rate;
      if (!av1_txfm_search(cpi, x, bsize, rd_stats, rd_stats_y, rd_stats_uv,
                           rd_stats->rate, ref_best_rd)) {
        if (rd_stats_y->rate == INT_MAX && mode_index == 0) {
          return INT64_MAX;
        }
        continue;
      }
      const int skip_ctx = av1_get_skip_txfm_context(xd);
      const int y_rate =
          rd_stats->skip_txfm
              ? x->mode_costs.skip_txfm_cost[skip_ctx][1]
              : (rd_stats_y->rate + x->mode_costs.skip_txfm_cost[skip_ctx][0]);
      this_yrd = RDCOST(x->rdmult, y_rate + mode_rate, rd_stats_y->dist);

      const int64_t curr_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (curr_rd < ref_best_rd) {
        ref_best_rd = curr_rd;
        ref_skip_rd[0] = skip_rd;
        ref_skip_rd[1] = skip_rdy;
      }
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        inter_mode_data_push(
            tile_data, mbmi->bsize, rd_stats->sse, rd_stats->dist,
            rd_stats_y->rate + rd_stats_uv->rate +
                mode_costs->skip_txfm_cost[skip_ctx][mbmi->skip_txfm]);
      }
    }

    if (this_mode == GLOBALMV || this_mode == GLOBAL_GLOBALMV) {
      if (is_nontrans_global_motion(xd, xd->mi[0])) {
        mbmi->interp_filters =
            av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));
      }
    }

    const int64_t tmp_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    if (mode_index == 0) {
      args->simple_rd[this_mode][mbmi->ref_mv_idx][mbmi->ref_frame[0]] = tmp_rd;
    }
    if (mode_index == 0 || tmp_rd < best_rd) {
      // Update best_rd data if this is the best motion mode so far
      best_mbmi = *mbmi;
      best_rd = tmp_rd;
      best_rd_stats = *rd_stats;
      best_rd_stats_y = *rd_stats_y;
      best_rate_mv = tmp_rate_mv;
      *yrd = this_yrd;
      if (num_planes > 1) best_rd_stats_uv = *rd_stats_uv;
      memcpy(best_blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
      av1_copy_array(best_tx_type_map, xd->tx_type_map, xd->height * xd->width);
      best_xskip_txfm = mbmi->skip_txfm;
    }
  }
  // Update RD and mbmi stats for selected motion mode
  mbmi->ref_frame[1] = ref_frame_1;
  *rate_mv = best_rate_mv;
  if (best_rd == INT64_MAX || !av1_check_newmv_joint_nonzero(cm, x)) {
    av1_invalid_rd_stats(rd_stats);
    restore_dst_buf(xd, *orig_dst, num_planes);
    return INT64_MAX;
  }
  *mbmi = best_mbmi;
  *rd_stats = best_rd_stats;
  *rd_stats_y = best_rd_stats_y;
  if (num_planes > 1) *rd_stats_uv = best_rd_stats_uv;
  memcpy(txfm_info->blk_skip, best_blk_skip,
         sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, xd->height * xd->width);
  txfm_info->skip_txfm = best_xskip_txfm;

  restore_dst_buf(xd, *orig_dst, num_planes);
  return 0;
}